

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O3

CLInt * __thiscall CLInt::operator=(CLInt *this,string *other)

{
  stringstream sstream;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::operator<<(local_188,(string *)other);
  std::istream::operator>>((istream *)asStack_198,(int *)(this + 0x50));
  this[0x58] = (CLInt)0x1;
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return this;
}

Assistant:

CLInt& operator=(const std::string& other) {
        std::stringstream sstream ;
        sstream << other ;
        sstream >> value ;
        is_set = true ;
        return *this ;
    }